

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O1

int dbuf_put_self(DynBuf *s,size_t offset,size_t len)

{
  int iVar1;
  size_t new_size;
  
  new_size = s->size + len;
  if ((s->allocated_size < new_size) && (iVar1 = dbuf_realloc(s,new_size), iVar1 != 0)) {
    return -1;
  }
  memcpy(s->buf + s->size,s->buf + offset,len);
  s->size = s->size + len;
  return 0;
}

Assistant:

int dbuf_put_self(DynBuf *s, size_t offset, size_t len)
{
    if (unlikely((s->size + len) > s->allocated_size)) {
        if (dbuf_realloc(s, s->size + len))
            return -1;
    }
    memcpy(s->buf + s->size, s->buf + offset, len);
    s->size += len;
    return 0;
}